

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O2

Am_Object create_new_obj_internal(Am_Object *prototype,Am_Inter_Location *data)

{
  char cVar1;
  ushort uVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  ostream *poVar6;
  bool *in_RDX;
  bool create_line;
  int d;
  int c;
  int b;
  int a;
  Am_Object local_40;
  Am_Style color;
  Am_Object ref_obj;
  Am_Object color_rect;
  Am_Object local_20;
  
  ref_obj.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location(in_RDX,(Am_Object *)&create_line,(int *)&ref_obj,&a,&b,&c);
  cVar1 = Am_Object::operator!=(&ref_obj,&created_objs);
  if (cVar1 != '\0') {
    Am_Translate_Coordinates(&ref_obj,a,b,&created_objs,&a,&b);
    if (create_line == true) {
      Am_Translate_Coordinates(&ref_obj,c,d,&created_objs,&c,&d);
    }
  }
  color_rect.data = (Am_Object_Data *)0x0;
  pAVar3 = (Am_Value *)Am_Object::Get(0x56f0,0x169);
  Am_Object::operator=(&color_rect,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&color_rect,0x6a);
  Am_Style::Am_Style(&color,pAVar3);
  prototype->data = (Am_Object_Data *)0x0;
  if (create_line == true) {
    Am_Object::Create((char *)&local_40);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&color);
    uVar2 = Am_Object::Set((ushort)&local_40,(Am_Wrapper *)0x6b,(ulong)pAVar4);
    uVar2 = Am_Object::Set(uVar2,0x8b,(ulong)(uint)a);
    uVar2 = Am_Object::Set(uVar2,0x8c,(ulong)(uint)b);
    uVar2 = Am_Object::Set(uVar2,0x8d,(ulong)(uint)c);
    pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x8e,(ulong)(uint)d);
    Am_Object::operator=(prototype,pAVar5);
    Am_Object::~Am_Object(&local_40);
    Set_XY_Anims_On(prototype);
  }
  else {
    cVar1 = Am_Object::Valid();
    if (cVar1 == '\0') {
      Am_Object::operator=(prototype,(Am_Object *)&Am_No_Object);
    }
    else {
      Am_Object::Create((char *)&local_40);
      uVar2 = Am_Object::Set((ushort)&local_40,100,(ulong)(uint)a);
      pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x65,(ulong)(uint)b);
      Am_Object::operator=(prototype,pAVar5);
      Am_Object::~Am_Object(&local_40);
      cVar1 = Am_Inter_Location::Get_Growing();
      if (cVar1 != '\0') {
        uVar2 = Am_Object::Set((ushort)prototype,0x66,(ulong)(uint)c);
        Am_Object::Set(uVar2,0x67,(ulong)(uint)d);
      }
      cVar1 = Am_Object::operator==((Am_Object *)data,&my_text_proto);
      if (cVar1 == '\0') {
        pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&color);
        uVar2 = 0x6a;
      }
      else {
        pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&color);
        uVar2 = 0x6b;
      }
      Am_Object::Set((ushort)prototype,(Am_Wrapper *)(ulong)uVar2,(ulong)pAVar4);
    }
  }
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n--++-- Created new object ");
    poVar6 = (ostream *)operator<<(poVar6,prototype);
    poVar6 = std::operator<<(poVar6," at (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,a);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,b);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,c);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,d);
    std::operator<<(poVar6,")\n");
    std::ostream::flush();
    Am_Object::Am_Object(&local_20,prototype);
    Am_Object::Add_Part((Am_Object)0x115688,SUB81(&local_20,0),1);
    Am_Object::~Am_Object(&local_20);
    Am_Object::operator=(&last_created_obj,prototype);
  }
  Am_Style::~Am_Style(&color);
  Am_Object::~Am_Object(&color_rect);
  Am_Object::~Am_Object(&ref_obj);
  return (Am_Object)(Am_Object_Data *)prototype;
}

Assistant:

Am_Object
create_new_obj_internal(Am_Object prototype, Am_Inter_Location data)
{
  Am_Object ref_obj;
  int a, b, c, d;
  bool create_line;
  data.Get_Location(create_line, ref_obj, a, b, c, d);
  if (ref_obj != created_objs) {
    Am_Translate_Coordinates(ref_obj, a, b, created_objs, a, b);
    if (create_line)
      Am_Translate_Coordinates(ref_obj, c, d, created_objs, c, d);
  }

  Am_Object color_rect;
  color_rect = color_panel.Get(Am_VALUE);
  Am_Style color = color_rect.Get(Am_FILL_STYLE);

  Am_Object new_obj;
  if (create_line) {
    new_obj = prototype.Create()
                  .Set(Am_LINE_STYLE, color, Am_NO_ANIMATION)
                  .Set(Am_X1, a, Am_NO_ANIMATION)
                  .Set(Am_Y1, b, Am_NO_ANIMATION)
                  .Set(Am_X2, c, Am_NO_ANIMATION)
                  .Set(Am_Y2, d, Am_NO_ANIMATION);
    Set_XY_Anims_On(new_obj);
  } else if (prototype.Valid()) {
    new_obj = prototype.Create()
                  .Set(Am_LEFT, a, Am_NO_ANIMATION)
                  .Set(Am_TOP, b, Am_NO_ANIMATION);
    if (data.Get_Growing())
      new_obj.Set(Am_WIDTH, c, Am_NO_ANIMATION)
          .Set(Am_HEIGHT, d, Am_NO_ANIMATION);
    if (prototype == my_text_proto)
      new_obj.Set(Am_LINE_STYLE, color, Am_NO_ANIMATION);
    else
      new_obj.Set(Am_FILL_STYLE, color, Am_NO_ANIMATION);
  } else
    new_obj = Am_No_Object;

  if (new_obj.Valid()) {
    std::cout << "\n--++-- Created new object " << new_obj << " at (" << a
              << "," << b << "," << c << "," << d << ")\n"
              << std::flush;
    created_objs.Add_Part(new_obj);
    last_created_obj = new_obj;
  }
  return new_obj;
}